

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O2

uint Imf_2_5::halfToUint(half h)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((-1 < (short)h._h) && ((~h._h & 0x7c00) != 0 || (h._h & 0x3ff) == 0)) {
    if (h._h != 0x7c00) {
      return (uint)(long)*(float *)((long)&half::_toFloat + (ulong)h._h * 4);
    }
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

unsigned int
halfToUint (half h)
{
    if (h.isNegative() || h.isNan())
	return 0;

    if (h.isInfinity())
	return UINT_MAX;

    return (unsigned int) h;
}